

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIScrollBar::setPos(CGUIScrollBar *this,s32 pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = this->Min;
  iVar2 = this->Max;
  if (pos <= iVar1) {
    pos = iVar1;
  }
  if (iVar2 <= pos) {
    pos = iVar2;
  }
  this->Pos = pos;
  if (1e-06 < ABS((float)(iVar2 - iVar1))) {
    if (this->Horizontal == true) {
      iVar4 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      iVar3 = *(int *)&this->field_0x3c - *(int *)&this->field_0x34;
    }
    else {
      iVar4 = *(int *)&this->field_0x3c - *(int *)&this->field_0x34;
      iVar3 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
    }
    this->DrawPos =
         (int)((float)iVar3 * 0.5 +
              (float)(pos - iVar1) * (((float)iVar3 * -3.0 + (float)iVar4) / (float)(iVar2 - iVar1))
              );
    this->DrawHeight = iVar3;
  }
  return;
}

Assistant:

void CGUIScrollBar::setPos(s32 pos)
{
	Pos = core::s32_clamp(pos, Min, Max);

	if (core::isnotzero(range())) {
		if (Horizontal) {
			f32 f = (RelativeRect.getWidth() - ((f32)RelativeRect.getHeight() * 3.0f)) / range();
			DrawPos = (s32)(((Pos - Min) * f) + ((f32)RelativeRect.getHeight() * 0.5f));
			DrawHeight = RelativeRect.getHeight();
		} else {
			f32 f = (RelativeRect.getHeight() - ((f32)RelativeRect.getWidth() * 3.0f)) / range();

			DrawPos = (s32)(((Pos - Min) * f) + ((f32)RelativeRect.getWidth() * 0.5f));
			DrawHeight = RelativeRect.getWidth();
		}
	}
}